

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

S1Interval __thiscall S1Interval::Expanded(S1Interval *this,double margin)

{
  Vector2_d VVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  S1Interval local_38;
  double local_28;
  double local_20;
  S2LogMessage local_18;
  
  dVar3 = (this->bounds_).c_[0];
  dVar4 = (this->bounds_).c_[1];
  if (0.0 <= margin) {
    if ((((dVar3 == 3.141592653589793) && (!NAN(dVar3))) && (dVar4 == -3.141592653589793)) &&
       (!NAN(dVar4))) goto LAB_0019c379;
    dVar4 = dVar4 - dVar3;
    if (dVar4 < 0.0) {
      uVar2 = -(ulong)(0.0 < dVar4 + 6.283185307179586);
      dVar4 = (double)((ulong)(dVar4 + 6.283185307179586) & uVar2 | ~uVar2 & 0xbff0000000000000);
    }
    if (6.283185307179586 <= margin + margin + dVar4 + 4.440892098500626e-16) {
      local_38.bounds_.c_[0] = -3.141592653589793;
      local_38.bounds_.c_[1] = 3.141592653589793;
      goto LAB_0019c4a6;
    }
  }
  else {
    if (((dVar3 == -3.141592653589793) && (!NAN(dVar3))) &&
       ((dVar4 == 3.141592653589793 && (!NAN(dVar4))))) {
LAB_0019c379:
      local_38.bounds_.c_[0] = (this->bounds_).c_[0];
      local_38.bounds_.c_[1] = (this->bounds_).c_[1];
      goto LAB_0019c4a6;
    }
    dVar4 = dVar4 - dVar3;
    if (dVar4 < 0.0) {
      uVar2 = -(ulong)(0.0 < dVar4 + 6.283185307179586);
      dVar4 = (double)((ulong)(dVar4 + 6.283185307179586) & uVar2 | ~uVar2 & 0xbff0000000000000);
    }
    if (margin + margin + dVar4 + -4.440892098500626e-16 <= 0.0) {
      local_38.bounds_.c_[0] = 3.141592653589793;
      local_38.bounds_.c_[1] = -3.141592653589793;
      goto LAB_0019c4a6;
    }
  }
  local_28 = margin;
  local_20 = remainder(dVar3 - margin,6.283185307179586);
  dVar3 = remainder(local_28 + (this->bounds_).c_[1],6.283185307179586);
  S1Interval(&local_38,local_20,dVar3);
  if ((local_38.bounds_.c_[0] <= -3.141592653589793) &&
     (local_38.bounds_.c_[0] = 3.141592653589793, 3.141592653589793 < ABS(local_38.bounds_.c_[1])))
  {
    S2LogMessage::S2LogMessage
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
               ,0xfe,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_18.stream_,"Check failed: is_valid() ",0x19);
    abort();
  }
LAB_0019c4a6:
  VVar1.c_[1] = local_38.bounds_.c_[1];
  VVar1.c_[0] = local_38.bounds_.c_[0];
  return (Vector2_d)(Vector2_d)VVar1.c_;
}

Assistant:

S1Interval S1Interval::Expanded(double margin) const {
  if (margin >= 0) {
    if (is_empty()) return *this;
    // Check whether this interval will be full after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin + 2 * DBL_EPSILON >= 2 * M_PI) return Full();
  } else {
    if (is_full()) return *this;
    // Check whether this interval will be empty after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin - 2 * DBL_EPSILON <= 0) return Empty();
  }
  S1Interval result(remainder(lo() - margin, 2*M_PI),
                    remainder(hi() + margin, 2*M_PI));
  if (result.lo() <= -M_PI) result.set_lo(M_PI);
  return result;
}